

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

ImageLevel * __thiscall Imf_3_4::Image::level(Image *this,int lx,int ly)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  bVar1 = levelNumberIsValid(this,lx,ly);
  if (bVar1) {
    return (this->_levels)._data[(long)ly * (this->_levels)._sizeY + (long)lx];
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_190,"Cannot access image level with invalid level number (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lx);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,ly);
  std::operator<<(poVar2,").");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

ImageLevel&
Image::level (int lx, int ly)
{
    if (!levelNumberIsValid (lx, ly))
    {
        THROW (
            ArgExc,
            "Cannot access image level with invalid "
            "level number ("
                << lx << ", " << ly << ").");
    }

    return *_levels[ly][lx];
}